

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_type(lyout *out,int level,lys_module *module,lys_type *type)

{
  uint8_t uVar1;
  byte bVar2;
  char cVar3;
  lys_type_bit *plVar4;
  uint uVar5;
  lyout *plVar6;
  int iVar7;
  lys_module *plVar8;
  char *pcVar9;
  lys_module *plVar10;
  lys_restr *restr;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  int attr_value;
  char *local_68;
  char *s;
  ulong local_58;
  lys_module *local_50;
  lyout *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int content2;
  
  local_3c = 0;
  iVar7 = lys_type_is_local(type);
  s = (char *)(ulong)(uint)level;
  if (iVar7 == 0) {
    uVar5 = level * 2;
    plVar8 = lys_main_module(type->der->module);
    pcVar9 = transform_module_name2import_prefix(module,plVar8->name);
    level = (int)s;
    ly_print(out,"%*s<type name=\"%s:%s\"",(ulong)uVar5,"",pcVar9,type->der->name);
  }
  else {
    yin_print_open(out,level,(char *)0x0,"type","name",type->der->name,0);
  }
  iVar7 = level + 1;
  uVar1 = type->ext_size;
  local_38 = iVar7;
  if (uVar1 != '\0') {
    ly_print(out,">\n");
    yin_print_extension_instances
              (out,iVar7,module,LYEXT_SUBSTMT_SELF,'\0',type->ext,(uint)type->ext_size);
  }
  content2 = (int)(uVar1 != '\0');
  local_50 = module;
  switch(type->base) {
  case LY_TYPE_BINARY:
    if ((type->info).bits.bit == (lys_type_bit *)0x0) break;
    if (uVar1 == '\0') {
      ly_print(out,">\n");
      content2 = 1;
    }
    restr = (type->info).dec64.range;
    pcVar9 = "length";
    goto LAB_0019186d;
  case LY_TYPE_BITS:
    if ((type->info).bits.count != 0) {
      local_40 = (int)s + 2;
      lVar12 = 0;
      uVar11 = 0;
      local_48 = out;
      do {
        local_3c = 0;
        local_58 = uVar11;
        if (content2 == 0) {
          ly_print(out,">\n");
          content2 = 1;
        }
        yin_print_open(out,local_38,(char *)0x0,"bit","name",
                       *(char **)((long)&((type->info).bits.bit)->name + lVar12),local_3c);
        iVar7 = local_40;
        plVar8 = local_50;
        yin_print_snode_common
                  (out,local_40,(lys_node *)((long)&((type->info).bits.bit)->name + lVar12),local_50
                   ,&local_3c,3);
        plVar6 = local_48;
        if ((*(byte *)((long)&((type->info).bits.bit)->flags + lVar12) & 1) == 0) {
          if (local_3c == 0) {
            local_3c = 1;
            ly_print(local_48,">\n");
          }
          iVar7 = local_40;
          plVar8 = local_50;
          plVar4 = (type->info).bits.bit;
          yin_print_unsigned(plVar6,local_40,LYEXT_SUBSTMT_POSITION,'\0',local_50,
                             *(lys_ext_instance ***)((long)&plVar4->ext + lVar12),
                             (uint)(&plVar4->ext_size)[lVar12],
                             *(uint *)((long)&plVar4->pos + lVar12));
        }
        out = local_48;
        uVar11 = local_58;
        yin_print_snode_common
                  (local_48,iVar7,(lys_node *)((long)&((type->info).bits.bit)->name + lVar12),plVar8
                   ,&local_3c,0x70);
        yin_print_close(out,local_38,(char *)0x0,"bit",local_3c);
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x30;
      } while (uVar11 < (type->info).bits.count);
    }
    break;
  case LY_TYPE_DEC64:
    if ((type->der->type).der == (lys_tpdf *)0x0) {
      if (uVar1 == '\0') {
        ly_print(out,">\n");
        content2 = 1;
      }
      yin_print_unsigned(out,local_38,LYEXT_SUBSTMT_DIGITS,'\0',module,type->ext,
                         (uint)type->ext_size,(uint)(type->info).dec64.dig);
    }
    if ((type->info).bits.bit == (lys_type_bit *)0x0) break;
    if (content2 == 0) {
LAB_00191849:
      ly_print(out,">\n");
      content2 = 1;
    }
    goto LAB_00191861;
  case LY_TYPE_ENUM:
    if ((type->info).bits.count != 0) {
      local_40 = (int)s + 2;
      lVar12 = 0;
      uVar11 = 0;
      local_48 = out;
      do {
        local_3c = 0;
        local_58 = uVar11;
        if (content2 == 0) {
          ly_print(out,">\n");
          content2 = 1;
        }
        yin_print_open(out,local_38,(char *)0x0,"enum","name",
                       *(char **)((long)&((type->info).bits.bit)->name + lVar12),local_3c);
        iVar7 = local_40;
        plVar8 = local_50;
        attr_value = 0x191c2e;
        yin_print_snode_common
                  (out,local_40,(lys_node *)((long)&((type->info).bits.bit)->name + lVar12),local_50
                   ,&local_3c,3);
        plVar6 = local_48;
        if ((*(byte *)((long)&((type->info).bits.bit)->flags + lVar12) & 1) == 0) {
          if (local_3c == 0) {
            local_3c = 1;
            attr_value = 0x191c60;
            ly_print(local_48,">\n");
          }
          iVar7 = local_40;
          plVar8 = local_50;
          plVar4 = (type->info).bits.bit;
          yin_print_signed(plVar6,local_40,LYEXT_SUBSTMT_SELF,(uint8_t)local_50,
                           *(lys_module **)((long)&plVar4->ext + lVar12),
                           (lys_ext_instance **)(ulong)(&plVar4->ext_size)[lVar12],
                           *(uint *)((long)&plVar4->pos + lVar12),attr_value);
        }
        uVar11 = local_58;
        yin_print_snode_common
                  (local_48,iVar7,(lys_node *)((long)&((type->info).bits.bit)->name + lVar12),plVar8
                   ,&local_3c,0x70);
        out = local_48;
        yin_print_close(local_48,local_38,(char *)0x0,"enum",local_3c);
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x30;
      } while (uVar11 < (type->info).bits.count);
    }
    break;
  case LY_TYPE_IDENT:
    if ((type->info).bits.count != 0) {
      if (uVar1 == '\0') {
        ly_print(out,">\n");
        content2 = 1;
      }
      if ((type->info).bits.count != 0) {
        uVar11 = 0;
        do {
          plVar8 = lys_main_module(*(lys_module **)((&((type->info).bits.bit)->name)[uVar11] + 0x30)
                                  );
          plVar10 = lys_main_module(module);
          if (plVar10 == plVar8) {
            pcVar9 = (&((type->info).bits.bit)->name)[uVar11];
            yin_print_substmt(out,local_38,LYEXT_SUBSTMT_BASE,'\0',*(char **)pcVar9,module,
                              *(lys_ext_instance ***)(pcVar9 + 0x20),(uint)(byte)pcVar9[0x1a]);
          }
          else {
            pcVar9 = transform_module_name2import_prefix(module,plVar8->name);
            iVar7 = asprintf(&local_68,"%s:%s",pcVar9);
            if (iVar7 == -1) {
              ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "yin_print_type");
            }
            else {
              pcVar9 = (&((type->info).bits.bit)->name)[uVar11];
              yin_print_substmt(out,local_38,LYEXT_SUBSTMT_BASE,'\0',local_68,module,
                                *(lys_ext_instance ***)(pcVar9 + 0x20),(uint)(byte)pcVar9[0x1a]);
              free(local_68);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (type->info).bits.count);
      }
    }
    break;
  case LY_TYPE_INST:
    cVar3 = (type->info).inst.req;
    if (cVar3 != -1) {
      if (cVar3 != '\x01') break;
      iVar7 = local_38;
      if (uVar1 == '\0') {
LAB_00191b5d:
        iVar7 = local_38;
        ly_print(out,">\n");
        content2 = 1;
      }
      goto LAB_00191b79;
    }
    bVar13 = uVar1 == '\0';
LAB_00191f4b:
    iVar7 = local_38;
    if (bVar13) {
      ly_print(out,">\n");
      content2 = 1;
    }
    bVar2 = type->ext_size;
    pcVar9 = "false";
    goto LAB_00191f79;
  case LY_TYPE_LEAFREF:
    iVar7 = ly_strequal_(type->der->name,"leafref");
    if (iVar7 != 0) {
      if (uVar1 == '\0') {
        ly_print(out,">\n");
        content2 = 1;
      }
      pcVar9 = transform_json2schema(module,(type->info).lref.path);
      yin_print_substmt(out,local_38,LYEXT_SUBSTMT_PATH,'\0',pcVar9,module,type->ext,
                        (uint)type->ext_size);
      lydict_remove(module->ctx,pcVar9);
    }
    cVar3 = (type->info).lref.req;
    if (cVar3 == -1) {
      bVar13 = content2 == 0;
      goto LAB_00191f4b;
    }
    if (cVar3 != '\x01') break;
    iVar7 = local_38;
    if (content2 == 0) goto LAB_00191b5d;
LAB_00191b79:
    bVar2 = type->ext_size;
    pcVar9 = "true";
LAB_00191f79:
    yin_print_substmt(out,iVar7,LYEXT_SUBSTMT_REQINSTANCE,'\0',pcVar9,module,type->ext,(uint)bVar2);
    break;
  case LY_TYPE_STRING:
    if ((type->info).bits.bit != (lys_type_bit *)0x0) {
      if (uVar1 == '\0') {
        ly_print(out,">\n");
        content2 = 1;
      }
      yin_print_typerestr(out,local_38,module,(type->info).dec64.range,"length");
    }
    if ((type->info).str.pat_count != 0) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        if (content2 == 0) {
          ly_print(out,">\n");
          content2 = 1;
        }
        yin_print_typerestr(out,local_38,local_50,
                            (lys_restr *)(((type->info).lref.target)->padding + lVar12 + -0x1c),
                            "pattern");
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x38;
      } while (uVar11 < (type->info).str.pat_count);
    }
    break;
  case LY_TYPE_UNION:
    if ((type->info).bits.count != 0) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        if (content2 == 0) {
          ly_print(out,">\n");
          content2 = 1;
        }
        yin_print_type(out,local_38,local_50,
                       (lys_type *)((long)&((type->info).bits.bit)->name + lVar12));
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x40;
      } while (uVar11 < (type->info).bits.count);
    }
    break;
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    if ((type->info).bits.bit == (lys_type_bit *)0x0) break;
    if (uVar1 == '\0') goto LAB_00191849;
LAB_00191861:
    restr = (type->info).dec64.range;
    pcVar9 = "range";
LAB_0019186d:
    yin_print_typerestr(out,local_38,module,restr,pcVar9);
  }
  yin_print_close(out,(int)s,(char *)0x0,"type",content2);
  return;
}

Assistant:

static void
yin_print_type(struct lyout *out, int level, const struct lys_module *module, const struct lys_type *type)
{
    unsigned int i;
    int content = 0, content2 = 0;
    const char *str;
    char *s;
    struct lys_module *mod;

    if (!lys_type_is_local(type)) {
        ly_print(out, "%*s<type name=\"%s:%s\"", LEVEL, INDENT,
                 transform_module_name2import_prefix(module, lys_main_module(type->der->module)->name), type->der->name);
    } else {
        yin_print_open(out, level, NULL, "type", "name", type->der->name, content);
    }
    level++;

    /* extensions */
    if (type->ext_size) {
        yin_print_close_parent(out, &content);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, type->ext, type->ext_size);
    }


    switch (type->base) {
    case LY_TYPE_BINARY:
        if (type->info.binary.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.binary.length, "length");
        }
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; ++i) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "bit", "name", type->info.bits.bit[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.bits.bit[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_unsigned(out, level + 1, LYEXT_SUBSTMT_POSITION, 0, module,
                                   type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                   type->info.bits.bit[i].pos);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "bit", content2);
        }
        break;
    case LY_TYPE_DEC64:
        if (!type->der->type.der) {
            yin_print_close_parent(out, &content);
            yin_print_unsigned(out, level, LYEXT_SUBSTMT_DIGITS, 0, module,
                               type->ext, type->ext_size, type->info.dec64.dig);
        }
        if (type->info.dec64.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.dec64.range, "range");
        }
        break;
    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; i++) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "enum", "name", type->info.enums.enm[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.enums.enm[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_signed(out, level + 1, LYEXT_SUBSTMT_VALUE, 0, module,
                                 type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                 type->info.enums.enm[i].value);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "enum", content2);
        }
        break;
    case LY_TYPE_IDENT:
        if (type->info.ident.count) {
            yin_print_close_parent(out, &content);
            for (i = 0; i < type->info.ident.count; ++i) {
                mod = lys_main_module(type->info.ident.ref[i]->module);
                if (lys_main_module(module) == mod) {
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, type->info.ident.ref[i]->name,
                                      module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                } else {
                    if (asprintf(&s, "%s:%s", transform_module_name2import_prefix(module, mod->name),
                                 type->info.ident.ref[i]->name) == -1) {
                        LOGMEM(module->ctx);
                    } else {
                        yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, s,
                                          module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                        free(s);
                    }
                }
            }
        }
        break;
    case LY_TYPE_INST:
        if (type->info.inst.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.inst.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        if (type->info.num.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.num.range, "range");
        }
        break;
    case LY_TYPE_LEAFREF:
        if (ly_strequal(type->der->name, "leafref", 0)) {
            yin_print_close_parent(out, &content);
            str = transform_json2schema(module, type->info.lref.path);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_PATH, 0, str, module, type->ext, type->ext_size);
            lydict_remove(module->ctx, str);
        }
        if (type->info.lref.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.lref.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_STRING:
        if (type->info.str.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.str.length, "length");
        }
        for (i = 0; i < type->info.str.pat_count; i++) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, &type->info.str.patterns[i], "pattern");
        }
        break;
    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; ++i) {
            yin_print_close_parent(out, &content);
            yin_print_type(out, level, module, &type->info.uni.types[i]);
        }
        break;
    default:
        /* other types do not have substatements */
        break;
    }

    level--;
    yin_print_close(out, level, NULL, "type", content);
}